

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * kwssys::SystemTools::DecodeURL(string *__return_storage_ptr__,string *url)

{
  pointer pcVar1;
  undefined1 *puVar2;
  bool bVar3;
  ulong uVar4;
  char bytes [3];
  RegularExpression urlByteRe;
  char local_288;
  char cStack_287;
  undefined1 uStack_286;
  undefined5 uStack_285;
  undefined1 local_278 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  RegularExpression local_260;
  
  local_260.regmust = (char *)0x0;
  local_260.program = (char *)0x0;
  local_260.progsize = 0;
  memset(&local_260,0,0x20a);
  RegularExpression::compile(&local_260,"%[0-9a-fA-F][0-9a-fA-F]");
  local_268 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_268;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (url->_M_string_length != 0) {
    uVar4 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_288,(ulong)url);
      bVar3 = RegularExpression::find
                        (&local_260,
                         (char *)CONCAT53(uStack_285,
                                          CONCAT12(uStack_286,CONCAT11(cStack_287,local_288))),
                         &local_260.regmatch);
      puVar2 = (undefined1 *)
               CONCAT53(uStack_285,CONCAT12(uStack_286,CONCAT11(cStack_287,local_288)));
      if (puVar2 != local_278) {
        operator_delete(puVar2);
      }
      if (bVar3) {
        pcVar1 = (url->_M_dataplus)._M_p;
        local_288 = pcVar1[uVar4 + 1];
        cStack_287 = pcVar1[uVar4 + 2];
        uStack_286 = 0;
        strtoul(&local_288,(char **)0x0,0x10);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar4 = uVar4 + 2;
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < url->_M_string_length);
  }
  if (local_260.program != (char *)0x0) {
    operator_delete__(local_260.program);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::DecodeURL(const std::string& url)
{
  kwsys::RegularExpression urlByteRe(VTK_URL_BYTE_REGEX);
  std::string ret;
  for (size_t i = 0; i < url.length(); i++) {
    if (urlByteRe.find(url.substr(i, 3))) {
      char bytes[] = { url[i + 1], url[i + 2], '\0' };
      ret += static_cast<char>(strtoul(bytes, nullptr, 16));
      i += 2;
    } else {
      ret += url[i];
    }
  }
  return ret;
}